

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

void __thiscall
unodb::detail::
basic_inode<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>,_2U,_4U,_(unodb::node_type)1,_unodb::detail::fake_inode,_unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::basic_inode(basic_inode<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>,_2U,_4U,_(unodb::node_type)1,_unodb::detail::fake_inode,_unodb::detail::olc_inode_16<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::olc_inode_4<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              *this,key_view k1,art_key_type shifted_k2,
             tree_depth<unodb::detail::basic_art_key<unsigned_long>_> depth)

{
  basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  ::basic_inode_impl(&this->
                      super_basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                     ,2,k1,shifted_k2,depth);
  if ((this->
      super_basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
      ).children_count.value.super___atomic_base<unsigned_char>._M_i == '\x02') {
    return;
  }
  __assert_fail("is_min_size()",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x4c9,
                "unodb::detail::basic_inode<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>, 2, 4, unodb::node_type::I4, unodb::detail::fake_inode, unodb::detail::olc_inode_16<unsigned long, std::span<const std::byte>>, unodb::detail::olc_inode_4<unsigned long, std::span<const std::byte>>>::basic_inode(unodb::key_view, art_key_type, tree_depth<art_key_type>) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>, MinSize = 2, Capacity = 4, NodeType = unodb::node_type::I4, SmallerDerived = unodb::detail::fake_inode, LargerDerived = unodb::detail::olc_inode_16<unsigned long, std::span<const std::byte>>, Derived = unodb::detail::olc_inode_4<unsigned long, std::span<const std::byte>>]"
               );
}

Assistant:

constexpr basic_inode(unodb::key_view k1, art_key_type shifted_k2,
                        tree_depth<art_key_type> depth) noexcept
      : parent{MinSize, k1, shifted_k2, depth} {
    UNODB_DETAIL_ASSERT(is_min_size());
  }